

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

void __thiscall RealTrafficConnection::MainDirect(RealTrafficConnection *this)

{
  bool bVar1;
  byte bVar2;
  positionTy *in_RDI;
  exception *e;
  positionTy pos_1;
  exception *e_1;
  unique_lock<std::mutex> lk;
  positionTy pos;
  ThreadSettings TS;
  mutex_type *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined2 in_stack_fffffffffffffde4;
  byte in_stack_fffffffffffffde6;
  undefined1 in_stack_fffffffffffffde7;
  unique_lock<std::mutex> *in_stack_fffffffffffffde8;
  ThreadSettings *in_stack_fffffffffffffdf0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffdf8;
  deque<double,_std::allocator<double>_> *in_stack_fffffffffffffe00;
  undefined1 bAllowNanAltIfGnd;
  undefined1 local_1d0 [48];
  positionTy *in_stack_fffffffffffffe60;
  RealTrafficConnection *in_stack_fffffffffffffe68;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe70;
  int local_164;
  duration<long,std::ratio<1l,1l>> local_160 [8];
  undefined8 local_158;
  duration local_150;
  duration local_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  int local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  double local_100;
  undefined1 local_f8 [248];
  
  ThreadSettings::ThreadSettings
            (in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
             CONCAT13(in_stack_fffffffffffffde7,
                      CONCAT12(in_stack_fffffffffffffde6,in_stack_fffffffffffffde4)),
             (char *)in_stack_fffffffffffffdd8);
  *(undefined4 *)&in_RDI[7]._ts = 0;
  std::deque<double,_std::allocator<double>_>::clear(in_stack_fffffffffffffe00);
  *(undefined4 *)&in_RDI[7]._pitch = 1;
  std::__cxx11::string::clear();
  in_RDI[9]._head = NAN;
  *(undefined4 *)&in_RDI[0xb]._head = 0;
  in_RDI[0x1a]._alt = -NAN;
  bVar1 = DataRefs::ShallKeepParkedAircraft((DataRefs *)0x21bc09);
  bAllowNanAltIfGnd = false;
  if (bVar1) {
    bAllowNanAltIfGnd = LTAptAvailable();
  }
  *(undefined1 *)&in_RDI[0x1a]._ts = bAllowNanAltIfGnd;
  bVar1 = WeatherCanSet();
  if (bVar1) {
    LTWeather::ComputeInterpol
              (in_stack_fffffffffffffe70,(array<float,_13UL> *)in_stack_fffffffffffffe68);
    memcpy(&in_RDI[0x17]._ts,local_f8,0xd0);
  }
  while (bVar2 = (**(code **)((long)in_RDI->_lat + 0x20))(), (bVar2 & 1) != 0) {
    DataRefs::GetViewPos();
    bVar1 = positionTy::isNormal(in_RDI,(bool)bAllowNanAltIfGnd);
    if (bVar1) {
      in_RDI[9]._lat = local_100;
      in_RDI[8].mergeCount = local_110;
      *(undefined4 *)&in_RDI[8].f = uStack_10c;
      *(undefined4 *)&in_RDI[8].edgeIdx = uStack_108;
      *(undefined4 *)((long)&in_RDI[8].edgeIdx + 4) = uStack_104;
      *(undefined4 *)&in_RDI[8]._pitch = local_120;
      *(undefined4 *)((long)&in_RDI[8]._pitch + 4) = uStack_11c;
      *(undefined4 *)&in_RDI[8]._roll = uStack_118;
      *(undefined4 *)((long)&in_RDI[8]._roll + 4) = uStack_114;
      *(undefined4 *)&in_RDI[8]._ts = local_130;
      *(undefined4 *)((long)&in_RDI[8]._ts + 4) = uStack_12c;
      *(undefined4 *)&in_RDI[8]._head = uStack_128;
      *(undefined4 *)((long)&in_RDI[8]._head + 4) = uStack_124;
      *(undefined4 *)&in_RDI[8]._lon = local_140;
      *(undefined4 *)((long)&in_RDI[8]._lon + 4) = uStack_13c;
      *(undefined4 *)&in_RDI[8]._alt = uStack_138;
      *(undefined4 *)((long)&in_RDI[8]._alt + 4) = uStack_134;
      bVar2 = (**(code **)((long)in_RDI->_lat + 0x80))(in_RDI,&local_140);
      if (((bVar2 & 1) != 0) &&
         (bVar2 = (**(code **)((long)in_RDI->_lat + 0x88))(), (bVar2 & 1) != 0)) {
        (**(code **)((long)in_RDI->_lat + 0x48))();
      }
      local_148.__r = (rep)SetRequType(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
      *(rep *)&in_RDI[1].mergeCount = local_148.__r;
    }
    else {
      local_158 = std::chrono::_V2::steady_clock::now();
      local_164 = 1;
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_160,&local_164);
      in_stack_fffffffffffffdf8 =
           std::chrono::operator+
                     ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)in_stack_fffffffffffffde8,
                      (duration<long,_std::ratio<1L,_1L>_> *)
                      CONCAT17(in_stack_fffffffffffffde7,
                               CONCAT16(in_stack_fffffffffffffde6,
                                        CONCAT24(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0
                                                ))));
      *(duration *)&in_RDI[1].mergeCount = in_stack_fffffffffffffdf8.__d.__r;
      local_150 = in_stack_fffffffffffffdf8.__d.__r;
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_fffffffffffffde7,
                        CONCAT16(in_stack_fffffffffffffde6,
                                 CONCAT24(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0))),
               in_stack_fffffffffffffdd8);
    std::condition_variable::
    wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,RealTrafficConnection::MainDirect()::__0>
              ((condition_variable *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)CONCAT17(in_stack_fffffffffffffde7,
                           CONCAT16(in_stack_fffffffffffffde6,
                                    CONCAT24(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0))),
               (anon_class_8_1_8991fb9c)in_stack_fffffffffffffdf8.__d.__r);
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_fffffffffffffde7,
                        CONCAT16(in_stack_fffffffffffffde6,
                                 CONCAT24(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0))));
  }
  DataRefs::GetViewPos();
  SetRequType(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  bVar2 = (**(code **)((long)in_RDI->_lat + 0x80))(in_RDI,local_1d0);
  if (((bVar2 & 1) != 0) &&
     (in_stack_fffffffffffffde6 = (**(code **)((long)in_RDI->_lat + 0x88))(),
     (in_stack_fffffffffffffde6 & 1) != 0)) {
    (**(code **)((long)in_RDI->_lat + 0x48))();
  }
  WeatherReset();
  ThreadSettings::~ThreadSettings
            ((ThreadSettings *)
             CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffde6,
                                     CONCAT24(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0)))
            );
  return;
}

Assistant:

void RealTrafficConnection::MainDirect ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_RT_Direct", LC_ALL_MASK);
    eConnType = RT_CONN_REQU_REPL;
    // Clear the list of historic time stamp differences
    dequeTS.clear();
    // Some more data resets to make sure we start over with the series of requests
    curr.eRequType = CurrTy::RT_REQU_AUTH;
    curr.sGUID.clear();
    rtWx.QNH = NAN;
    rtWx.nErr = 0;
    lTotalFlights = -1;
    // can right away read parked traffic if parked aircraft enabled and airport data is already available, otherwise we'll be triggered later when airport data has been processed
    bDoParkedTraffic = dataRefs.ShallKeepParkedAircraft() && LTAptAvailable();
    // If we could theoretically set weather we prepare the interpolation settings
    if (WeatherCanSet()) {
        rtWx.interp = LTWeather::ComputeInterpol(RT_ATMOS_LAYERS,
                                                 rtWx.w.atmosphere_alt_levels_m);
    }

    while ( shallRun() ) {
        // LiveTraffic Top Level Exception Handling
        try {
            // where are we right now?
            const positionTy pos (dataRefs.GetViewPos());

            // If the camera position is valid we can request data around it
            if (pos.isNormal()) {
                // Fetch data and process it
                curr.pos = pos;
                if (FetchAllData(pos) && ProcessFetchedData())
                    // reduce error count if processed successfully
                    // as a chance to appear OK in the long run
                    DecErrCnt();
                
                // Determine next action and wait time
                tNextWakeup = SetRequType(pos);
            }
            else {
                // Camera position is yet invalid, retry in a second
                tNextWakeup = std::chrono::steady_clock::now() + std::chrono::seconds(1);
            }
            
            // sleep for a bit or if woken up for termination
            // by condition variable trigger
            {
                std::unique_lock<std::mutex> lk(FDThreadSynchMutex);
                FDThreadSynchCV.wait_until(lk, tNextWakeup,
                                           [this]{return !shallRun();});
            }
            
        } catch (const std::exception& e) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
            IncErrCnt();
        } catch (...) {
            LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, "(unknown type)");
            IncErrCnt();
        }
    }
    
    // Close the session with RealTraffic
    try {
        const positionTy pos (dataRefs.GetViewPos());
        SetRequType(pos);
        if (FetchAllData(pos) && ProcessFetchedData())
            // reduce error count if processed successfully
            // as a chance to appear OK in the long run
            DecErrCnt();
    } catch (const std::exception& e) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
        IncErrCnt();
    } catch (...) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, "(unknown type)");
        IncErrCnt();
    }
    
    // Reset weather control (this assumes noone else can control weather and
    // would need to change once any other source in LiveTraffic can do so)
    WeatherReset();
}